

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

void mcu8str_dealloc(mcu8str *str)

{
  char *__ptr;
  
  if (str->owns_memory == 0) {
    __ptr = (char *)0x0;
  }
  else {
    __ptr = str->c_str;
  }
  str->c_str = mcu8str_dealloc::dummy;
  str->size = 0;
  str->buflen = 0;
  str->owns_memory = 0;
  if (__ptr != (char *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void mcu8str_dealloc( mcu8str* str )
  {
    char * buf_to_free = ( str->owns_memory
                           ? str->c_str
                           : NULL );
    static char dummy[4] = { 0, 0, 0, 0 };
    str->c_str = &dummy[0];
    str->size = 0;
    str->buflen = 0;
    str->owns_memory = 0;
    if ( buf_to_free )
      STDNS free( buf_to_free );
  }